

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O2

bool __thiscall
absl::anon_unknown_0::IsSurrogate
          (anon_unknown_0 *this,char32_t c,string_view src,Nullable<std::string_*> error)

{
  string *this_00;
  AlphaNum *b;
  uint uVar1;
  undefined4 in_register_00000034;
  string local_a0;
  AlphaNum local_80;
  string_view local_50 [3];
  
  this_00 = (string *)src._M_str;
  uVar1 = (uint)this & 0xfffff800;
  b = (AlphaNum *)CONCAT71(src._M_str._1_7_,this_00 == (string *)0x0 || uVar1 != 0xd800);
  if (this_00 != (string *)0x0 && uVar1 == 0xd800) {
    local_50[0] = NullSafeStringView("invalid surrogate character (0xD800-DFFF): \\");
    local_80.piece_._M_len = CONCAT44(in_register_00000034,c);
    local_80.piece_._M_str = (char *)src._M_len;
    StrCat_abi_cxx11_(&local_a0,(absl *)local_50,&local_80,b);
    std::__cxx11::string::operator=(this_00,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return uVar1 == 0xd800;
}

Assistant:

inline bool IsSurrogate(char32_t c, absl::string_view src,
                        absl::Nullable<std::string*> error) {
  if (c >= 0xD800 && c <= 0xDFFF) {
    if (error) {
      *error = absl::StrCat("invalid surrogate character (0xD800-DFFF): \\",
                            src);
    }
    return true;
  }
  return false;
}